

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_27f2b3d::Impl::registerHandler
          (Impl *this,TypeInfo *typeinfo,GenericEventHandler *handler)

{
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*)>_>_>,_false,_true>,_bool>
  pVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_80;
  TypeInfo *local_70;
  function<void_(const_void_*)> local_68;
  string local_48 [32];
  
  std::unique_lock<std::mutex>::unique_lock(&local_80,&(this->handlers).eventMutex);
  (*typeinfo->_vptr_TypeInfo[2])(local_48,typeinfo);
  local_70 = typeinfo;
  std::function<void_(const_void_*)>::function(&local_68,handler);
  pVar1 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::__cxx11::string,std::pair<dap::TypeInfo_const*,std::function<void(void_const*)>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&(this->handlers).eventMap,local_48,&local_70);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  std::__cxx11::string::~string(local_48);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (*typeinfo->_vptr_TypeInfo[2])(&local_70,typeinfo);
    EventHandlers::errorfLocked
              (&this->handlers,"Event handler for \'%s\' already registered",local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_80);
  return;
}

Assistant:

void registerHandler(const dap::TypeInfo* typeinfo,
                       const GenericEventHandler& handler) override {
    handlers.put(typeinfo, handler);
  }